

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O0

longlong VmLongPow(longlong power,longlong number)

{
  undefined4 local_30;
  undefined4 local_2c;
  undefined8 local_28;
  longlong result;
  longlong number_local;
  longlong power_local;
  
  if (power < 0) {
    if (number == 1) {
      local_2c = 1;
    }
    else {
      if (number == -1) {
        local_30 = 1;
        if ((power & 1U) != 0) {
          local_30 = -1;
        }
      }
      else {
        local_30 = 0;
      }
      local_2c = local_30;
    }
    power_local = (longlong)local_2c;
  }
  else {
    local_28 = 1;
    result = number;
    for (number_local = power; number_local != 0; number_local = number_local >> 1) {
      if ((number_local & 1U) != 0) {
        local_28 = result * local_28;
        number_local = number_local + -1;
      }
      result = result * result;
    }
    power_local = local_28;
  }
  return power_local;
}

Assistant:

long long VmLongPow(long long power, long long number)
{
	if(power < 0)
		return number == 1 ? 1 : (number == -1 ? ((power & 1) ? -1 : 1) : 0);

	long long result = 1;
	while(power)
	{
		if(power & 1)
		{
			result *= number;
			power--;
		}
		number *= number;
		power >>= 1;
	}
	return result;
}